

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O0

errr Term_addstr(wchar_t n,wchar_t a,char *buf)

{
  int iVar1;
  bool bVar2;
  wchar_t local_103c;
  wchar_t local_1038 [2];
  wchar_t s [1024];
  wchar_t local_2c;
  errr res;
  wchar_t w;
  wchar_t k;
  char *buf_local;
  wchar_t local_10;
  wchar_t a_local;
  wchar_t n_local;
  
  iVar1 = Term->wid;
  local_2c = L'\0';
  text_mbstowcs(local_1038,buf,L'Ѐ');
  if ((Term->scr->cu & 1U) == 0) {
    local_103c = n;
    if (n < L'\0') {
      local_103c = iVar1 + L'\x01';
    }
    local_10 = L'\0';
    while( true ) {
      bVar2 = false;
      if (local_10 < local_103c) {
        bVar2 = local_1038[local_10] != L'\0';
      }
      if (!bVar2) break;
      local_10 = local_10 + L'\x01';
    }
    if (iVar1 <= Term->scr->cx + local_10) {
      local_2c = iVar1 - Term->scr->cx;
      local_10 = local_2c;
    }
    Term_queue_chars(Term->scr->cx,Term->scr->cy,local_10,a,local_1038);
    Term->scr->cx = local_10 + Term->scr->cx;
    if (local_2c != L'\0') {
      Term->scr->cu = true;
    }
    a_local = local_2c;
  }
  else {
    a_local = L'\xffffffff';
  }
  return a_local;
}

Assistant:

errr Term_addstr(int n, int a, const char *buf)
{
	int k;

	int w = Term->wid;

	errr res = 0;

	wchar_t s[1024];

	/* Copy to a rewriteable string */
 	text_mbstowcs(s, buf, 1024);

	/* Handle "unusable" cursor */
	if (Term->scr->cu) return (-1);

	/* Obtain maximal length */
	k = (n < 0) ? (w + 1) : n;

	/* Obtain the usable string length */
	for (n = 0; (n < k) && s[n]; n++) /* loop */;

	/* React to reaching the edge of the screen */
	if (Term->scr->cx + n >= w) res = n = w - Term->scr->cx;

	/* Queue the first "n" characters for display */
	Term_queue_chars(Term->scr->cx, Term->scr->cy, n, a, s);

	/* Advance the cursor */
	Term->scr->cx += n;

	/* Hack -- Notice "Useless" cursor */
	if (res) Term->scr->cu = 1;

	/* Success (usually) */
	return (res);
}